

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.h
# Opt level: O2

bool __thiscall
absl::lts_20240722::flags_internal::
FlagValue<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(absl::lts_20240722::flags_internal::FlagValueStorageKind)3>
::Get(FlagValue<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(absl::lts_20240722::flags_internal::FlagValueStorageKind)3>
      *this,SequenceLock *param_1,
     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     *dst)

{
  ptr_t pvVar1;
  uint uVar2;
  
  pvVar1 = (this->super_FlagMaskedPointerValue).value._M_i.ptr_;
  uVar2 = (uint)pvVar1 & 3;
  if (uVar2 == 3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(dst,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((ulong)pvVar1 & 0xfffffffffffffffc));
  }
  return uVar2 == 3;
}

Assistant:

constexpr T InitDefaultValue(EmptyBraces) {
  return T{};
}